

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

void __thiscall
InsertProxyModelPrivate::onMoved
          (InsertProxyModelPrivate *this,bool isRow,QModelIndex *parent,int start,int end,
          QModelIndex *destination,int destIdx)

{
  bool bVar1;
  long from;
  
  bVar1 = QModelIndex::isValid(parent);
  if (bVar1) {
    return;
  }
  bVar1 = QModelIndex::isValid(destination);
  if (bVar1) {
    onRemoved(this,isRow,parent,start,end);
    return;
  }
  for (from = (long)end; start <= from; from = from + -1) {
    QList<QMap<int,_QVariant>_>::move(this->m_extraData + !isRow,from,(long)destIdx);
  }
  if (isRow) {
    QAbstractItemModel::endMoveRows();
    return;
  }
  QAbstractItemModel::endMoveColumns();
  return;
}

Assistant:

void InsertProxyModelPrivate::onMoved(bool isRow, const QModelIndex &parent, int start, int end, const QModelIndex &destination, int destIdx)
{
    if (parent.isValid())
        return;
    if (destination.isValid())
        return onRemoved(isRow, parent, start, end);
    for (; start <= end; --end)
        m_extraData[!isRow].move(end, destIdx);
    Q_Q(InsertProxyModel);
    isRow ? q->endMoveRows() : q->endMoveColumns();
}